

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::CopySceneFlat(aiScene **_dest,aiScene *src)

{
  undefined4 uVar1;
  aiScene *paVar2;
  long lVar3;
  byte bVar4;
  
  bVar4 = 0;
  if (src != (aiScene *)0x0 && _dest != (aiScene **)0x0) {
    if (*_dest == (aiScene *)0x0) {
      paVar2 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(paVar2);
      *_dest = paVar2;
    }
    else {
      aiScene::~aiScene(*_dest);
      aiScene::aiScene(*_dest);
    }
    paVar2 = *_dest;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *(undefined4 *)&src->field_0x4;
      paVar2->mFlags = src->mFlags;
      *(undefined4 *)&paVar2->field_0x4 = uVar1;
      src = (aiScene *)((long)src + (ulong)bVar4 * -0x10 + 8);
      paVar2 = (aiScene *)((long)paVar2 + (ulong)bVar4 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

void SceneCombiner::CopySceneFlat(aiScene** _dest,const aiScene* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    // reuse the old scene or allocate a new?
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    } else {
        *_dest = new aiScene();
    }

    ::memcpy(*_dest,src,sizeof(aiScene));
}